

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ylib_feature(lyd_node *parent,lysp_module *pmod)

{
  LY_ERR LVar1;
  bool bVar2;
  lysp_feature *local_50;
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_feature *f;
  uint64_t u;
  lysp_module *pmod_local;
  lyd_node *parent_local;
  
  if (pmod->mod->implemented == '\0') {
    parent_local._4_4_ = LY_SUCCESS;
  }
  else {
    _ret___1 = pmod->features;
    while( true ) {
      bVar2 = false;
      if (pmod->features != (lysp_feature *)0x0) {
        bVar2 = (ulong)((long)_ret___1 - (long)pmod->features) >> 6 <
                *(ulong *)&pmod->features[-1].flags;
      }
      if (!bVar2) {
        f = (lysp_feature *)0x0;
        while( true ) {
          if (pmod->includes == (lysp_include *)0x0) {
            local_50 = (lysp_feature *)0x0;
          }
          else {
            local_50 = *(lysp_feature **)(pmod->includes[-1].rev + 8);
          }
          if (local_50 <= f) break;
          _ret___1 = (pmod->includes[(long)f].submodule)->features;
          while( true ) {
            bVar2 = false;
            if ((pmod->includes[(long)f].submodule)->features != (lysp_feature *)0x0) {
              bVar2 = (ulong)((long)_ret___1 - (long)(pmod->includes[(long)f].submodule)->features)
                      >> 6 < *(ulong *)&(pmod->includes[(long)f].submodule)->features[-1].flags;
            }
            if (!bVar2) break;
            if (((_ret___1->flags & 0x20) != 0) &&
               (LVar1 = lyd_new_term(parent,(lys_module *)0x0,"feature",_ret___1->name,0,
                                     (lyd_node **)0x0), LVar1 != LY_SUCCESS)) {
              return LVar1;
            }
            _ret___1 = _ret___1 + 1;
          }
          f = (lysp_feature *)((long)&f->name + 1);
        }
        return LY_SUCCESS;
      }
      if (((_ret___1->flags & 0x20) != 0) &&
         (parent_local._4_4_ =
               lyd_new_term(parent,(lys_module *)0x0,"feature",_ret___1->name,0,(lyd_node **)0x0),
         parent_local._4_4_ != LY_SUCCESS)) break;
      _ret___1 = _ret___1 + 1;
    }
  }
  return parent_local._4_4_;
}

Assistant:

static LY_ERR
ylib_feature(struct lyd_node *parent, const struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_feature *f;

    if (!pmod->mod->implemented) {
        /* no features can be enabled */
        return LY_SUCCESS;
    }

    LY_ARRAY_FOR(pmod->features, struct lysp_feature, f) {
        if (!(f->flags & LYS_FENABLED)) {
            continue;
        }

        LY_CHECK_RET(lyd_new_term(parent, NULL, "feature", f->name, 0, NULL));
    }

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ARRAY_FOR(pmod->includes[u].submodule->features, struct lysp_feature, f) {
            if (!(f->flags & LYS_FENABLED)) {
                continue;
            }

            LY_CHECK_RET(lyd_new_term(parent, NULL, "feature", f->name, 0, NULL));
        }
    }

    return LY_SUCCESS;
}